

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O3

Result __thiscall wabt::anon_unknown_15::BinaryReaderObjdump::EndModule(BinaryReaderObjdump *this)

{
  ObjdumpOptions *pOVar1;
  ObjdumpState *pOVar2;
  ulong uVar3;
  Enum EVar4;
  Enum EVar5;
  pointer pRVar6;
  long lVar7;
  ulong uVar8;
  
  pOVar1 = (this->super_BinaryReaderObjdumpBase).options_;
  if ((pOVar1->section_name == (char *)0x0) ||
     ((this->super_BinaryReaderObjdumpBase).section_found_ != false)) {
    EVar4 = Ok;
    EVar5 = Ok;
    if ((pOVar1->relocs == true) &&
       (((EVar5 = EVar4, pOVar1->mode == Details &&
         (((this->super_BinaryReaderObjdumpBase).print_details_ & 1U) != 0)) &&
        (pOVar2 = (this->super_BinaryReaderObjdumpBase).objdump_state_,
        ((long)(pOVar2->data_relocations).
               super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(pOVar2->data_relocations).
               super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
               super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 -
        (ulong)this->next_data_reloc_ != 0)))) {
      Stream::Writef(&((this->super_BinaryReaderObjdumpBase).err_stream_._M_t.
                       super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                       .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl)->super_Stream
                     ,"Data reloctions outside of segments!:\n");
      uVar8 = (ulong)this->next_data_reloc_;
      pOVar2 = (this->super_BinaryReaderObjdumpBase).objdump_state_;
      pRVar6 = (pOVar2->data_relocations).
               super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = ((long)(pOVar2->data_relocations).
                     super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pRVar6 >> 3) * -0x5555555555555555;
      EVar5 = Error;
      if (uVar8 <= uVar3 && uVar3 - uVar8 != 0) {
        lVar7 = uVar8 * 0x18;
        do {
          BinaryReaderObjdumpBase::PrintRelocation
                    (&this->super_BinaryReaderObjdumpBase,(Reloc *)((long)&pRVar6->type + lVar7),
                     *(Offset *)((long)&pRVar6->offset + lVar7));
          uVar8 = uVar8 + 1;
          pOVar2 = (this->super_BinaryReaderObjdumpBase).objdump_state_;
          pRVar6 = (pOVar2->data_relocations).
                   super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar7 = lVar7 + 0x18;
        } while (uVar8 < (ulong)(((long)(pOVar2->data_relocations).
                                        super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar6 >>
                                 3) * -0x5555555555555555));
      }
    }
  }
  else {
    Stream::Writef(&((this->super_BinaryReaderObjdumpBase).err_stream_._M_t.
                     super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                     .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl)->super_Stream,
                   "Section not found: %s\n");
    EVar5 = Error;
  }
  return (Result)EVar5;
}

Assistant:

Result BinaryReaderObjdump::EndModule() {
  if (options_->section_name && !section_found_) {
    err_stream_->Writef("Section not found: %s\n", options_->section_name);
    return Result::Error;
  }

  if (options_->relocs && ShouldPrintDetails()) {
    if (next_data_reloc_ != objdump_state_->data_relocations.size()) {
      err_stream_->Writef("Data reloctions outside of segments!:\n");
      for (size_t i = next_data_reloc_;
           i < objdump_state_->data_relocations.size(); i++) {
        const Reloc& reloc = objdump_state_->data_relocations[i];
        PrintRelocation(reloc, reloc.offset);
      }

      return Result::Error;
    }
  }

  return Result::Ok;
}